

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint nWords;
  undefined4 in_register_00000034;
  size_t __n;
  int iVar5;
  long lVar6;
  bool bVar7;
  uint uCanonPhase;
  int pStoreIn [17];
  char pCanonPermCopy [16];
  uint local_c0;
  int local_bc;
  undefined8 local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  int local_98 [20];
  char local_48 [24];
  
  local_b8 = CONCAT44(in_register_00000034,nVars);
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  local_b0 = (ulong)nWords;
  if (0 < (int)nWords) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicize::pCopy1 + lVar2) =
           *(undefined8 *)((long)pTruth + lVar2);
      lVar2 = lVar2 + 8;
    } while (local_b0 * 8 - lVar2 != 0);
  }
  iVar5 = 0;
  local_c0 = Abc_TtSemiCanonicize(pTruth,nVars,pCanonPerm,local_98,0);
  __n = (size_t)nVars;
  local_a0 = (ulong)(nVars - 1);
  local_a8 = (ulong)(nVars - 2) + 1;
  while (1 < (int)local_b8) {
    uVar3 = 0;
    lVar2 = local_a8;
    local_bc = iVar5;
    do {
      if (local_98[lVar2 + -1] == local_98[lVar2]) {
        uVar1 = Abc_TtCofactorPerm(pTruth,(int)lVar2 + -1,nWords,
                                   (uint)(local_98[lVar2 + -1] != local_98[__n] / 2),pCanonPerm,
                                   &local_c0,1);
        uVar3 = uVar3 | uVar1;
      }
      lVar6 = lVar2 + -1;
      bVar7 = 0 < lVar2;
      lVar2 = lVar6;
    } while (lVar6 != 0 && bVar7);
    if (uVar3 == 0) break;
    bVar7 = true;
    if (2 < (int)local_b8) {
      uVar3 = 0;
      uVar4 = 1;
      do {
        if (local_98[uVar4] == local_98[uVar4 + 1]) {
          uVar1 = Abc_TtCofactorPerm(pTruth,(int)uVar4,nWords,
                                     (uint)(local_98[uVar4] != local_98[__n] / 2),pCanonPerm,
                                     &local_c0,1);
          uVar3 = uVar3 | uVar1;
        }
        uVar4 = uVar4 + 1;
      } while (local_a0 != uVar4);
      bVar7 = uVar3 == 0;
    }
    if ((bVar7) || (iVar5 = local_bc + 1, iVar5 == 5)) break;
  }
  if (0 < (int)nWords) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicize::pCopy2 + lVar2) =
           *(undefined8 *)((long)pTruth + lVar2);
      lVar2 = lVar2 + 8;
    } while (local_b0 * 8 - lVar2 != 0);
  }
  memcpy(local_48,pCanonPerm,__n);
  uVar3 = local_c0;
  Abc_TtImplementNpnConfig(Abc_TtCanonicize::pCopy2,(int)local_b8,local_48,local_c0);
  if (0 < (int)nWords) {
    lVar2 = 0;
    do {
      if (*(long *)((long)Abc_TtCanonicize::pCopy1 + lVar2) !=
          *(long *)((long)Abc_TtCanonicize::pCopy2 + lVar2)) {
        puts("Canonical form verification failed!");
        return uVar3;
      }
      lVar2 = lVar2 + 8;
    } while (local_b0 << 3 != lVar2);
  }
  return uVar3;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn, 0 );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}